

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void * lua_upvalueid(lua_State *L,int fidx,int n)

{
  ushort uVar1;
  TValue *pTVar2;
  UpVal **ppUVar3;
  CClosure *f;
  StkId fi;
  int n_local;
  int fidx_local;
  lua_State *L_local;
  
  pTVar2 = index2addr(L,fidx);
  uVar1 = pTVar2->tt_ & 0x7f;
  if (uVar1 == 6) {
    ppUVar3 = getupvalref(L,fidx,n,(LClosure **)0x0,(ravi_type_map *)0x0);
    L_local = (lua_State *)*ppUVar3;
  }
  else {
    if (uVar1 != 0x26) {
      __assert_fail("(0) && \"closure expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x68b,"void *lua_upvalueid(lua_State *, int, int)");
    }
    if (pTVar2->tt_ != 0x8026) {
      __assert_fail("((((fi))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x686,"void *lua_upvalueid(lua_State *, int, int)");
    }
    if (((pTVar2->value_).gc)->tt != '&') {
      __assert_fail("(((fi)->value_).gc)->tt == ((6) | ((2) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x686,"void *lua_upvalueid(lua_State *, int, int)");
    }
    if ((n < 1) || ((int)(uint)(byte)(pTVar2->value_).f[10] < n)) {
      __assert_fail("(1 <= n && n <= f->nupvalues) && \"invalid upvalue index\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x687,"void *lua_upvalueid(lua_State *, int, int)");
    }
    L_local = (lua_State *)((pTVar2->value_).f + (long)(n + -1) * 0x10 + 0x20);
  }
  return L_local;
}

Assistant:

LUA_API void *lua_upvalueid (lua_State *L, int fidx, int n) {
  StkId fi = index2addr(L, fidx);
  switch (ttype(fi)) {
    case LUA_TLCL: {  /* lua closure */
      return *getupvalref(L, fidx, n, NULL, NULL);
    }
    case LUA_TCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      api_check(L, 1 <= n && n <= f->nupvalues, "invalid upvalue index");
      return &f->upvalue[n - 1];
    }
    default: {
      api_check(L, 0, "closure expected");
      return NULL;
    }
  }
}